

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emulator.cpp
# Opt level: O0

void __thiscall Emulator::run(Emulator *this,uint sleep_time)

{
  duration<long,_std::ratio<1L,_1000000L>_> local_20;
  uint local_14;
  Emulator *pEStack_10;
  uint sleep_time_local;
  Emulator *this_local;
  
  this->running = true;
  local_14 = sleep_time;
  pEStack_10 = this;
  while ((this->running & 1U) != 0) {
    update_keys(this);
    run_instruction(this);
    update_timers(this);
    update_screen(this);
    std::chrono::duration<long,std::ratio<1l,1000000l>>::duration<unsigned_int,void>
              ((duration<long,std::ratio<1l,1000000l>> *)&local_20,&local_14);
    std::this_thread::sleep_for<long,std::ratio<1l,1000000l>>(&local_20);
  }
  return;
}

Assistant:

void Emulator::run(uint sleep_time){
	running = true;

	// Main loop. Each cycle we update keys state, run a single instruction,
	// update timers and update the screen.
	while (running){
		update_keys();
		run_instruction();
		update_timers();
		update_screen();
		std::this_thread::sleep_for(std::chrono::microseconds(sleep_time));
	}
}